

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodePtr __thiscall Parser::ParseDefaultExportClause<false>(Parser *this)

{
  tokens tVar1;
  IdentPtr localName;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Scanner_t *pSVar5;
  ParseNodePtr pPVar6;
  ModuleImportOrExportEntryList *importOrExportEntryList;
  IdentPtr exportName;
  ParseNodePtr pnodeExpression;
  RestorePoint parsedFunction;
  RestorePoint parsedAsync;
  ParseNodeClass *pnodeClass;
  RestorePoint parsedClass;
  BOOL classHasName;
  ushort flags;
  ParseNodePtr pnode;
  Parser *this_local;
  
  if ((this->m_token).tk != tkDEFAULT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0xb32,"(m_token.tk == tkDEFAULT)","m_token.tk == tkDEFAULT");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
  _classHasName = (ParseNodeClass *)0x0;
  parsedClass.m_cMultiUnits._6_2_ = 0;
  tVar1 = (this->m_token).tk;
  if (tVar1 == tkFUNCTION) {
LAB_0154a7ff:
    RestorePoint::RestorePoint((RestorePoint *)&pnodeExpression);
    pSVar5 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar5,(RestorePoint *)&pnodeExpression);
    pSVar5 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
    if ((this->m_token).tk == tkStar) {
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
    }
    if ((this->m_token).tk == tkID) {
      parsedClass.m_cMultiUnits._6_2_ = parsedClass.m_cMultiUnits._6_2_ | 1;
    }
    else {
      parsedClass.m_cMultiUnits._6_2_ = parsedClass.m_cMultiUnits._6_2_ | 8;
    }
    pSVar5 = GetScanner(this);
    Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar5,(RestorePoint *)&pnodeExpression);
    _classHasName =
         (ParseNodeClass *)ParseFncDeclCheckScope<false>(this,parsedClass.m_cMultiUnits._6_2_,true);
  }
  else {
    if (tVar1 == tkCLASS) {
      parsedClass.m_cMultiUnits._0_4_ = 0;
      RestorePoint::RestorePoint((RestorePoint *)&pnodeClass);
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture(pSVar5,(RestorePoint *)&pnodeClass);
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
      if ((this->m_token).tk == tkID) {
        parsedClass.m_cMultiUnits._0_4_ = 1;
      }
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo(pSVar5,(RestorePoint *)&pnodeClass);
      _classHasName =
           ParseClassDecl<false>
                     (this,(BOOL)parsedClass.m_cMultiUnits,(LPCOLESTR)0x0,(uint32 *)0x0,
                      (uint32 *)0x0);
      goto LAB_0154a95a;
    }
    if ((tVar1 == tkID) &&
       (bVar3 = CheckContextualKeyword(this,(this->wellKnownPropertyPids).async), bVar3)) {
      RestorePoint::RestorePoint((RestorePoint *)&parsedFunction.m_cMultiUnits);
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                (pSVar5,(RestorePoint *)&parsedFunction.m_cMultiUnits);
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar5);
      if ((this->m_token).tk == tkFUNCTION) {
        parsedClass.m_cMultiUnits._6_2_ = parsedClass.m_cMultiUnits._6_2_ | 0x100;
        goto LAB_0154a7ff;
      }
      pSVar5 = GetScanner(this);
      Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                (pSVar5,(RestorePoint *)&parsedFunction.m_cMultiUnits);
    }
    pPVar6 = ParseExpr<false>(this,0,(BOOL *)0x0,1,0,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,
                              (IdentToken *)0x0,false,(bool *)0x0,(charcount_t *)0x0,(bool *)0x0);
    if ((pPVar6 != (ParseNodePtr)0x0) && (pPVar6->nop == knopComma)) {
      Error(this,-0x7ff5fc16,L"",L"");
    }
  }
LAB_0154a95a:
  localName = (this->wellKnownPropertyPids)._default;
  importOrExportEntryList = EnsureModuleLocalExportEntryList(this);
  AddModuleImportOrExportEntry
            (this,importOrExportEntryList,(IdentPtr)0x0,localName,localName,(IdentPtr)0x0,0);
  return &_classHasName->super_ParseNode;
}

Assistant:

ParseNodePtr Parser::ParseDefaultExportClause()
{
    Assert(m_token.tk == tkDEFAULT);

    this->GetScanner()->Scan();
    ParseNodePtr pnode = nullptr;
    ushort flags = fFncNoFlgs;

    switch (m_token.tk)
    {
    case tkCLASS:
    {

        // Before we parse the class itself we need to know if the class has an identifier name.
        // If it does, we'll treat this class as an ordinary class declaration which will bind
        // it to that name. Otherwise the class should parse as a nameless class expression and
        // bind only to the export binding.
        BOOL classHasName = false;
        RestorePoint parsedClass;
        this->GetScanner()->Capture(&parsedClass);
        this->GetScanner()->Scan();

        if (m_token.tk == tkID)
        {
            classHasName = true;
        }

        this->GetScanner()->SeekTo(parsedClass);
        ParseNodeClass * pnodeClass;
        pnode = pnodeClass = ParseClassDecl<buildAST>(classHasName, nullptr, nullptr, nullptr);

        if (buildAST)
        {
            AnalysisAssert(pnode != nullptr);
            Assert(pnode->nop == knopClassDecl);

            pnodeClass->SetIsDefaultModuleExport(true);
        }

        break;
    }
    case tkID:
        // If we parsed an async token, it could either modify the next token (if it is a
        // function token) or it could be an identifier (let async = 0; export default async;).
        // To handle both cases, when we parse an async token we need to keep the parser state
        // and rewind if the next token is not function.
        if (CheckContextualKeyword(wellKnownPropertyPids.async))
        {
            RestorePoint parsedAsync;
            this->GetScanner()->Capture(&parsedAsync);
            this->GetScanner()->Scan();
            if (m_token.tk == tkFUNCTION)
            {
                // Token after async is function, consume the async token and continue to parse the
                // function as an async function.
                flags |= fFncAsync;
                goto LFunction;
            }
            // Token after async is not function, no idea what the async token is supposed to mean
            // so rewind and let the default case handle it.
            this->GetScanner()->SeekTo(parsedAsync);
        }
        goto LDefault;
        break;
    case tkFUNCTION:
    {
    LFunction:
        // We just parsed a function token but we need to figure out if the function
        // has an identifier name or not before we call the helper.
        RestorePoint parsedFunction;
        this->GetScanner()->Capture(&parsedFunction);
        this->GetScanner()->Scan();

        if (m_token.tk == tkStar)
        {
            // If we saw 'function*' that indicates we are going to parse a generator,
            // but doesn't tell us if the generator has an identifier or not.
            // Skip the '*' token for now as it doesn't matter yet.
            this->GetScanner()->Scan();
        }

        // We say that if the function has an identifier name, it is a 'normal' declaration
        // and should create a binding to that identifier as well as one for our default export.
        if (m_token.tk == tkID)
        {
            flags |= fFncDeclaration;
        }
        else
        {
            flags |= fFncNoName;
        }

        // Rewind back to the function token and let the helper handle the parsing.
        this->GetScanner()->SeekTo(parsedFunction);
        pnode = ParseFncDeclCheckScope<buildAST>(flags);

        if (buildAST)
        {
            AnalysisAssert(pnode != nullptr);
            Assert(pnode->nop == knopFncDecl);

            pnode->AsParseNodeFnc()->SetIsDefaultModuleExport(true);
        }
        break;
    }
    default:
    LDefault:
    {
        ParseNodePtr pnodeExpression = ParseExpr<buildAST>();

        // Consider: Can we detect this syntax error earlier?
        if (pnodeExpression && pnodeExpression->nop == knopComma)
        {
            Error(ERRsyntax);
        }

        if (buildAST)
        {
            AnalysisAssert(pnodeExpression != nullptr);

            // Mark this node as the default module export. We need to make sure it is put into the correct
            // module export slot when we emit the node.
            ParseNodeExportDefault * pnodeExportDefault;
            pnode = pnodeExportDefault = CreateNodeForOpT<knopExportDefault>();
            pnode->AsParseNodeExportDefault()->pnodeExpr = pnodeExpression;
        }
        break;
    }
    }

    IdentPtr exportName = wellKnownPropertyPids._default;
    AddModuleImportOrExportEntry(EnsureModuleLocalExportEntryList(), nullptr, exportName, exportName, nullptr);

    return pnode;
}